

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# src_linear.c
# Opt level: O0

int linear_vari_process(SRC_PRIVATE *psrc,SRC_DATA *data)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double x;
  long lVar4;
  long *in_RSI;
  double *in_RDI;
  double dVar5;
  int ch;
  double rem;
  double input_index;
  double src_ratio;
  LINEAR_DATA *priv;
  double in_stack_ffffffffffffffb8;
  int local_3c;
  double local_30;
  double local_28;
  int local_4;
  
  if (in_RSI[2] < 1) {
    local_4 = 0;
  }
  else if (in_RDI[4] == 0.0) {
    local_4 = 5;
  }
  else {
    dVar1 = in_RDI[4];
    if (*(int *)((long)dVar1 + 8) != 0) {
      for (local_3c = 0; local_3c < *(int *)((long)dVar1 + 4); local_3c = local_3c + 1) {
        *(undefined4 *)((long)dVar1 + 0x30 + (long)local_3c * 4) =
             *(undefined4 *)(*in_RSI + (long)local_3c * 4);
      }
      *(undefined4 *)((long)dVar1 + 8) = 0;
    }
    *(long *)((long)dVar1 + 0x10) = in_RSI[2] * (long)*(int *)((long)dVar1 + 4);
    *(long *)((long)dVar1 + 0x20) = in_RSI[3] * (long)*(int *)((long)dVar1 + 4);
    *(undefined8 *)((long)dVar1 + 0x28) = 0;
    *(undefined8 *)((long)dVar1 + 0x18) = 0;
    local_28 = *in_RDI;
    iVar3 = is_bad_src_ratio(local_28);
    if (iVar3 == 0) {
      local_30 = in_RDI[1];
      while( true ) {
        bVar2 = false;
        if (local_30 < 1.0) {
          bVar2 = *(long *)((long)dVar1 + 0x28) < *(long *)((long)dVar1 + 0x20);
        }
        if ((!bVar2) ||
           ((double)*(long *)((long)dVar1 + 0x10) <=
            (double)*(int *)((long)dVar1 + 4) * (local_30 + 1.0) +
            (double)*(long *)((long)dVar1 + 0x18))) break;
        if ((0 < *(long *)((long)dVar1 + 0x20)) && (1e-20 < ABS(*in_RDI - (double)in_RSI[7]))) {
          local_28 = *in_RDI + ((double)*(long *)((long)dVar1 + 0x28) *
                               ((double)in_RSI[7] - *in_RDI)) /
                               (double)*(long *)((long)dVar1 + 0x20);
        }
        for (local_3c = 0; local_3c < *(int *)((long)dVar1 + 4); local_3c = local_3c + 1) {
          *(float *)(in_RSI[1] + *(long *)((long)dVar1 + 0x28) * 4) =
               (float)(local_30 *
                       (double)(*(float *)(*in_RSI + (long)local_3c * 4) -
                               *(float *)((long)dVar1 + 0x30 + (long)local_3c * 4)) +
                      (double)*(float *)((long)dVar1 + 0x30 + (long)local_3c * 4));
          *(long *)((long)dVar1 + 0x28) = *(long *)((long)dVar1 + 0x28) + 1;
        }
        local_30 = 1.0 / local_28 + local_30;
      }
      dVar5 = fmod_one(in_stack_ffffffffffffffb8);
      x = (double)(long)*(int *)((long)dVar1 + 4);
      lVar4 = lrint(local_30 - dVar5);
      *(long *)((long)dVar1 + 0x18) = (long)x * lVar4 + *(long *)((long)dVar1 + 0x18);
      local_30 = dVar5;
      while( true ) {
        bVar2 = false;
        if (*(long *)((long)dVar1 + 0x28) < *(long *)((long)dVar1 + 0x20)) {
          bVar2 = (double)*(int *)((long)dVar1 + 4) * local_30 +
                  (double)*(long *)((long)dVar1 + 0x18) < (double)*(long *)((long)dVar1 + 0x10);
        }
        if (!bVar2) break;
        if ((0 < *(long *)((long)dVar1 + 0x20)) && (1e-20 < ABS(*in_RDI - (double)in_RSI[7]))) {
          local_28 = *in_RDI + ((double)*(long *)((long)dVar1 + 0x28) *
                               ((double)in_RSI[7] - *in_RDI)) /
                               (double)*(long *)((long)dVar1 + 0x20);
        }
        for (local_3c = 0; local_3c < *(int *)((long)dVar1 + 4); local_3c = local_3c + 1) {
          *(float *)(in_RSI[1] + *(long *)((long)dVar1 + 0x28) * 4) =
               (float)(local_30 *
                       (double)(*(float *)(*in_RSI +
                                          (*(long *)((long)dVar1 + 0x18) + (long)local_3c) * 4) -
                               *(float *)(*in_RSI +
                                         ((*(long *)((long)dVar1 + 0x18) -
                                          (long)*(int *)((long)dVar1 + 4)) + (long)local_3c) * 4)) +
                      (double)*(float *)(*in_RSI +
                                        ((*(long *)((long)dVar1 + 0x18) -
                                         (long)*(int *)((long)dVar1 + 4)) + (long)local_3c) * 4));
          *(long *)((long)dVar1 + 0x28) = *(long *)((long)dVar1 + 0x28) + 1;
        }
        dVar5 = 1.0 / local_28 + local_30;
        local_30 = fmod_one(x);
        iVar3 = *(int *)((long)dVar1 + 4);
        lVar4 = lrint(dVar5 - local_30);
        *(long *)((long)dVar1 + 0x18) = iVar3 * lVar4 + *(long *)((long)dVar1 + 0x18);
      }
      if (*(long *)((long)dVar1 + 0x10) < *(long *)((long)dVar1 + 0x18)) {
        local_30 = (double)((*(long *)((long)dVar1 + 0x18) - *(long *)((long)dVar1 + 0x10)) /
                           (long)*(int *)((long)dVar1 + 4)) + local_30;
        *(undefined8 *)((long)dVar1 + 0x18) = *(undefined8 *)((long)dVar1 + 0x10);
      }
      in_RDI[1] = local_30;
      if (0 < *(long *)((long)dVar1 + 0x18)) {
        for (local_3c = 0; local_3c < *(int *)((long)dVar1 + 4); local_3c = local_3c + 1) {
          *(undefined4 *)((long)dVar1 + 0x30 + (long)local_3c * 4) =
               *(undefined4 *)
                (*in_RSI +
                ((*(long *)((long)dVar1 + 0x18) - (long)*(int *)((long)dVar1 + 4)) + (long)local_3c)
                * 4);
        }
      }
      *in_RDI = local_28;
      in_RSI[4] = *(long *)((long)dVar1 + 0x18) / (long)*(int *)((long)dVar1 + 4);
      in_RSI[5] = *(long *)((long)dVar1 + 0x28) / (long)*(int *)((long)dVar1 + 4);
      local_4 = 0;
    }
    else {
      local_4 = 0x16;
    }
  }
  return local_4;
}

Assistant:

static int
linear_vari_process (SRC_PRIVATE *psrc, SRC_DATA *data)
{	LINEAR_DATA *priv ;
	double		src_ratio, input_index, rem ;
	int			ch ;

	if (data->input_frames <= 0)
		return SRC_ERR_NO_ERROR ;

	if (psrc->private_data == NULL)
		return SRC_ERR_NO_PRIVATE ;

	priv = (LINEAR_DATA*) psrc->private_data ;

	if (priv->reset)
	{	/* If we have just been reset, set the last_value data. */
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [ch] ;
		priv->reset = 0 ;
		} ;

	priv->in_count = data->input_frames * priv->channels ;
	priv->out_count = data->output_frames * priv->channels ;
	priv->in_used = priv->out_gen = 0 ;

	src_ratio = psrc->last_ratio ;

	if (is_bad_src_ratio (src_ratio))
		return SRC_ERR_BAD_INTERNAL_STATE ;

	input_index = psrc->last_position ;

	/* Calculate samples before first sample in input array. */
	while (input_index < 1.0 && priv->out_gen < priv->out_count)
	{
		if (priv->in_used + priv->channels * (1.0 + input_index) >= priv->in_count)
			break ;

		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = (float) (priv->last_value [ch] + input_index *
										(data->data_in [ch] - priv->last_value [ch])) ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		} ;

	rem = fmod_one (input_index) ;
	priv->in_used += priv->channels * lrint (input_index - rem) ;
	input_index = rem ;

	/* Main processing loop. */
	while (priv->out_gen < priv->out_count && priv->in_used + priv->channels * input_index < priv->in_count)
	{
		if (priv->out_count > 0 && fabs (psrc->last_ratio - data->src_ratio) > SRC_MIN_RATIO_DIFF)
			src_ratio = psrc->last_ratio + priv->out_gen * (data->src_ratio - psrc->last_ratio) / priv->out_count ;

		if (SRC_DEBUG && priv->in_used < priv->channels && input_index < 1.0)
		{	printf ("Whoops!!!!   in_used : %ld     channels : %d     input_index : %f\n", priv->in_used, priv->channels, input_index) ;
			exit (1) ;
			} ;

		for (ch = 0 ; ch < priv->channels ; ch++)
		{	data->data_out [priv->out_gen] = (float) (data->data_in [priv->in_used - priv->channels + ch] + input_index *
						(data->data_in [priv->in_used + ch] - data->data_in [priv->in_used - priv->channels + ch])) ;
			priv->out_gen ++ ;
			} ;

		/* Figure out the next index. */
		input_index += 1.0 / src_ratio ;
		rem = fmod_one (input_index) ;

		priv->in_used += priv->channels * lrint (input_index - rem) ;
		input_index = rem ;
		} ;

	if (priv->in_used > priv->in_count)
	{	input_index += (priv->in_used - priv->in_count) / priv->channels ;
		priv->in_used = priv->in_count ;
		} ;

	psrc->last_position = input_index ;

	if (priv->in_used > 0)
		for (ch = 0 ; ch < priv->channels ; ch++)
			priv->last_value [ch] = data->data_in [priv->in_used - priv->channels + ch] ;

	/* Save current ratio rather then target ratio. */
	psrc->last_ratio = src_ratio ;

	data->input_frames_used = priv->in_used / priv->channels ;
	data->output_frames_gen = priv->out_gen / priv->channels ;

	return SRC_ERR_NO_ERROR ;
}